

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_conncache_add_conn(Curl_easy *data)

{
  connectdata *conn_00;
  conncache *pcVar1;
  long lVar2;
  void *pvVar3;
  char local_b8 [8];
  char key [128];
  conncache *connc;
  connectdata *conn;
  connectbundle *bundle;
  Curl_easy *pCStack_10;
  CURLcode result;
  Curl_easy *data_local;
  
  bundle._4_4_ = CURLE_OK;
  conn = (connectdata *)0x0;
  conn_00 = data->conn;
  pcVar1 = (data->state).conn_cache;
  pCStack_10 = data;
  conn = (connectdata *)Curl_conncache_find_bundle(data,conn_00,(data->state).conn_cache);
  if (conn == (connectdata *)0x0) {
    bundle._4_4_ = bundle_create((connectbundle **)&conn);
    if (bundle._4_4_ != CURLE_OK) goto LAB_008e93cb;
    hashkey(conn_00,local_b8,0x80);
    pvVar3 = conncache_add_bundle((pCStack_10->state).conn_cache,local_b8,(connectbundle *)conn);
    if (pvVar3 == (void *)0x0) {
      bundle_destroy((connectbundle *)conn);
      bundle._4_4_ = CURLE_OUT_OF_MEMORY;
      goto LAB_008e93cb;
    }
  }
  bundle_add_conn((connectbundle *)conn,conn_00);
  lVar2 = pcVar1->next_connection_id;
  pcVar1->next_connection_id = lVar2 + 1;
  conn_00->connection_id = lVar2;
  pcVar1->num_conn = pcVar1->num_conn + 1;
LAB_008e93cb:
  if (pCStack_10->share != (Curl_share *)0x0) {
    Curl_share_unlock(pCStack_10,CURL_LOCK_DATA_CONNECT);
  }
  return bundle._4_4_;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle = NULL;
  struct connectdata *conn = data->conn;
  struct conncache *connc = data->state.conn_cache;
  DEBUGASSERT(conn);

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(data, conn, data->state.conn_cache);
  if(!bundle) {
    char key[HASHKEY_SIZE];

    result = bundle_create(&bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key));

    if(!conncache_add_bundle(data->state.conn_cache, key, bundle)) {
      bundle_destroy(bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(data, "Added connection %ld. "
               "The cache now contains %zu members",
               conn->connection_id, connc->num_conn));

  unlock:
  CONNCACHE_UNLOCK(data);

  return result;
}